

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O3

void __thiscall
RGBColorSpace_StdIllumWhiteRec2020_Test::~RGBColorSpace_StdIllumWhiteRec2020_Test
          (RGBColorSpace_StdIllumWhiteRec2020_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RGBColorSpace, StdIllumWhiteRec2020) {
    XYZ xyz = SpectrumToXYZ(&RGBColorSpace::Rec2020->illuminant);
    RGB rgb = RGBColorSpace::Rec2020->ToRGB(xyz);
    EXPECT_GE(rgb.r, .99);
    EXPECT_LE(rgb.r, 1.01);
    EXPECT_GE(rgb.g, .99);
    EXPECT_LE(rgb.g, 1.01);
    EXPECT_GE(rgb.b, .99);
    EXPECT_LE(rgb.b, 1.01);
}